

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomSpacer::write(DomSpacer *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomProperty **ppDVar2;
  DomProperty *this_00;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long lVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"spacer";
    local_50.size = 6;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar5.m_size = (size_t)local_50.ptr;
  QVar5.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_name == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"name",4);
    QVar7.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_name).d.d;
    __n = (size_t)(this->m_attr_name).d.ptr;
    local_80.size = (this->m_attr_name).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar6.m_size = (size_t)local_50.ptr;
    QVar6.field_0.m_data = aVar3.m_data;
    QVar7.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar6,QVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar2 = (this->m_property).d.ptr;
  lVar1 = (this->m_property).d.size;
  for (lVar4 = 0; lVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    this_00 = *(DomProperty **)((long)ppDVar2 + lVar4);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"property",8);
    DomProperty::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomSpacer::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("spacer") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    writer.writeEndElement();
}